

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsRandomShaderProgram.cpp
# Opt level: O2

void __thiscall
deqp::gls::RandomShaderProgram::RandomShaderProgram
          (RandomShaderProgram *this,Shader *vertexShader,Shader *fragmentShader,
          int numUnifiedUniforms,ShaderInput **unifiedUniforms)

{
  _Rb_tree_header *p_Var1;
  Type TVar2;
  ShaderInput *pSVar3;
  RandomShaderProgram *pRVar4;
  Shader *pSVar5;
  ShaderProgramDeclaration *this_00;
  Variable *pVVar6;
  InternalError *pIVar7;
  Variable *pVVar8;
  ulong uVar9;
  int iVar10;
  GenericVecType GVar11;
  pointer ppSVar12;
  ulong uVar13;
  allocator<char> local_1f6;
  allocator<char> local_1f5;
  uint local_1f4;
  Sampler2DMap *local_1f0;
  Shader *local_1e8;
  RandomShaderProgram *local_1e0;
  Shader *local_1d8;
  undefined1 local_1d0 [32];
  GenericVecType local_1b0;
  string local_1a8 [32];
  FragmentSource local_188;
  string local_168 [32];
  Variable *vertexOutput;
  Variable *pVStack_140;
  pointer local_138;
  
  local_1f4 = numUnifiedUniforms;
  local_1f0 = (Sampler2DMap *)unifiedUniforms;
  sglr::pdec::ShaderProgramDeclaration::ShaderProgramDeclaration
            ((ShaderProgramDeclaration *)&vertexOutput);
  local_1e8 = vertexShader;
  std::__cxx11::string::string<std::allocator<char>>
            (local_1a8,(vertexShader->m_source)._M_dataplus._M_p,&local_1f5);
  std::__cxx11::string::string((string *)local_1d0,local_1a8);
  this_00 = sglr::pdec::ShaderProgramDeclaration::operator<<
                      ((ShaderProgramDeclaration *)&vertexOutput,(VertexSource *)local_1d0);
  std::__cxx11::string::string<std::allocator<char>>
            (local_168,(fragmentShader->m_source)._M_dataplus._M_p,&local_1f6);
  std::__cxx11::string::string((string *)&local_188,local_168);
  local_1e0 = this;
  local_1d8 = fragmentShader;
  sglr::pdec::ShaderProgramDeclaration::operator<<(this_00,&local_188);
  std::__cxx11::string::~string((string *)&local_188);
  std::__cxx11::string::~string(local_168);
  std::__cxx11::string::~string((string *)local_1d0);
  std::__cxx11::string::~string(local_1a8);
  for (ppSVar12 = (local_1e8->m_inputs).
                  super__Vector_base<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>.
                  _M_impl.super__Vector_impl_data._M_start; pSVar5 = local_1d8,
      ppSVar12 !=
      (local_1e8->m_inputs).
      super__Vector_base<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>._M_impl.
      super__Vector_impl_data._M_finish; ppSVar12 = ppSVar12 + 1) {
    pSVar3 = *ppSVar12;
    std::__cxx11::string::string<std::allocator<char>>
              (local_1a8,(pSVar3->m_variable->m_name)._M_dataplus._M_p,(allocator<char> *)&local_188
              );
    TVar2 = (pSVar3->m_variable->m_type).m_baseType;
    std::__cxx11::string::string((string *)local_1d0,local_1a8);
    local_1b0 = TVar2 == TYPE_INT ^ GENERICVECTYPE_LAST;
    if (TVar2 == TYPE_FLOAT) {
      local_1b0 = GENERICVECTYPE_FLOAT;
    }
    sglr::pdec::ShaderProgramDeclaration::operator<<
              ((ShaderProgramDeclaration *)&vertexOutput,(VertexAttribute *)local_1d0);
    std::__cxx11::string::~string((string *)local_1d0);
    std::__cxx11::string::~string(local_1a8);
  }
  for (ppSVar12 = (local_1d8->m_inputs).
                  super__Vector_base<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>.
                  _M_impl.super__Vector_impl_data._M_start;
      ppSVar12 !=
      (pSVar5->m_inputs).super__Vector_base<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>
      ._M_impl.super__Vector_impl_data._M_finish; ppSVar12 = ppSVar12 + 1) {
    TVar2 = ((*ppSVar12)->m_variable->m_type).m_baseType;
    local_1d0._0_4_ = TVar2 == TYPE_INT ^ GENERICVECTYPE_LAST;
    if (TVar2 == TYPE_FLOAT) {
      local_1d0._0_4_ = GENERICVECTYPE_FLOAT;
    }
    local_1d0[4] = false;
    sglr::pdec::ShaderProgramDeclaration::operator<<
              ((ShaderProgramDeclaration *)&vertexOutput,(VertexToFragmentVarying *)local_1d0);
  }
  uVar13 = 0;
  uVar9 = 0;
  if (0 < (int)local_1f4) {
    uVar9 = (ulong)local_1f4;
  }
  for (; uVar9 != uVar13; uVar13 = uVar13 + 1) {
    pSVar3 = *(ShaderInput **)((long)local_1f0 + uVar13 * 8);
    std::__cxx11::string::string<std::allocator<char>>
              (local_1a8,(pSVar3->m_variable->m_name)._M_dataplus._M_p,(allocator<char> *)&local_188
              );
    pVVar6 = pSVar3->m_variable;
    TVar2 = (pVVar6->m_type).m_baseType;
    GVar11 = 0x28;
    switch(TVar2) {
    case TYPE_FLOAT:
      iVar10 = 0;
      break;
    case TYPE_INT:
      iVar10 = 0x1a;
      break;
    case TYPE_BOOL:
      iVar10 = 0x22;
      break;
    default:
      GVar11 = 0x5e;
      if (TVar2 == TYPE_SAMPLER_CUBE) {
        GVar11 = 0x29;
      }
    case TYPE_SAMPLER_2D:
      goto switchD_0151e426_caseD_6;
    }
    GVar11 = iVar10 + (pVVar6->m_type).m_numElements;
switchD_0151e426_caseD_6:
    std::__cxx11::string::string((string *)local_1d0,local_1a8);
    local_1b0 = GVar11;
    sglr::pdec::ShaderProgramDeclaration::operator<<
              ((ShaderProgramDeclaration *)&vertexOutput,(Uniform *)local_1d0);
    std::__cxx11::string::~string((string *)local_1d0);
    std::__cxx11::string::~string(local_1a8);
  }
  local_1d0._0_4_ = GENERICVECTYPE_FLOAT;
  sglr::pdec::ShaderProgramDeclaration::operator<<
            ((ShaderProgramDeclaration *)&vertexOutput,(FragmentOutput *)local_1d0);
  pRVar4 = local_1e0;
  sglr::ShaderProgram::ShaderProgram
            (&local_1e0->super_ShaderProgram,(ShaderProgramDeclaration *)&vertexOutput);
  pSVar5 = local_1d8;
  sglr::pdec::ShaderProgramDeclaration::~ShaderProgramDeclaration
            ((ShaderProgramDeclaration *)&vertexOutput);
  (pRVar4->super_ShaderProgram).super_VertexShader._vptr_VertexShader =
       (_func_int **)&PTR_shadeVertices_01e70380;
  (pRVar4->super_ShaderProgram).super_GeometryShader._vptr_GeometryShader =
       (_func_int **)&DAT_01e703b8;
  (pRVar4->super_ShaderProgram).super_FragmentShader._vptr_FragmentShader =
       (_func_int **)&DAT_01e703d0;
  pRVar4->m_vertexShader = local_1e8;
  pRVar4->m_fragmentShader = pSVar5;
  pRVar4->m_numUnifiedUniforms = local_1f4;
  pRVar4->m_unifiedUniforms = (ShaderInput **)local_1f0;
  pVVar6 = findShaderOutputByName(local_1e8,"gl_Position");
  pRVar4->m_positionVar = pVVar6;
  (pRVar4->m_vertexOutputs).
  super__Vector_base<const_rsg::Variable_*,_std::allocator<const_rsg::Variable_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pRVar4->m_vertexOutputs).
  super__Vector_base<const_rsg::Variable_*,_std::allocator<const_rsg::Variable_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pRVar4->m_vertexOutputs).
  super__Vector_base<const_rsg::Variable_*,_std::allocator<const_rsg::Variable_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  vertexOutput = (Variable *)0x0;
  pVStack_140 = (Variable *)0x0;
  local_138 = (pointer)0x0;
  rsg::Shader::getOutputs
            (pSVar5,(vector<const_rsg::Variable_*,_std::allocator<const_rsg::Variable_*>_> *)
                    &vertexOutput);
  pVVar6 = vertexOutput;
  do {
    if (pVVar6 == pVStack_140) {
      pVVar8 = (Variable *)0x0;
      break;
    }
    pVVar8 = *(Variable **)&pVVar6->m_type;
    pVVar6 = (Variable *)&(pVVar6->m_type).m_typeName;
  } while (pVVar8->m_layoutLocation != 0);
  std::_Vector_base<const_rsg::Variable_*,_std::allocator<const_rsg::Variable_*>_>::~_Vector_base
            ((_Vector_base<const_rsg::Variable_*,_std::allocator<const_rsg::Variable_*>_> *)
             &vertexOutput);
  pRVar4->m_fragColorVar = pVVar8;
  p_Var1 = &(pRVar4->m_sampler2DMap)._M_t._M_impl.super__Rb_tree_header;
  (pRVar4->m_sampler2DMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (pRVar4->m_sampler2DMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (pRVar4->m_sampler2DMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header
  ;
  (pRVar4->m_sampler2DMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (pRVar4->m_sampler2DMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (pRVar4->m_samplerCubeMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_1f0 = &pRVar4->m_sampler2DMap;
  (pRVar4->m_samplerCubeMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
  ;
  p_Var1 = &(pRVar4->m_samplerCubeMap)._M_t._M_impl.super__Rb_tree_header;
  (pRVar4->m_samplerCubeMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (pRVar4->m_samplerCubeMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (pRVar4->m_samplerCubeMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  rsg::ExecutionContext::ExecutionContext(&pRVar4->m_execCtx,local_1f0,&pRVar4->m_samplerCubeMap);
  pVVar6 = pRVar4->m_positionVar;
  if (((pVVar6 == (Variable *)0x0) || ((pVVar6->m_type).m_baseType != TYPE_FLOAT)) ||
     ((pVVar6->m_type).m_numElements != 4)) {
    pIVar7 = (InternalError *)__cxa_allocate_exception(0x38);
    tcu::InternalError::InternalError
              (pIVar7,(char *)0x0,
               "m_positionVar && m_positionVar->getType().getBaseType() == rsg::VariableType::TYPE_FLOAT && m_positionVar->getType().getNumElements() == 4"
               ,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsRandomShaderProgram.cpp"
               ,0x8d);
  }
  else {
    pVVar6 = pRVar4->m_fragColorVar;
    if (((pVVar6 != (Variable *)0x0) && ((pVVar6->m_type).m_baseType == TYPE_FLOAT)) &&
       ((pVVar6->m_type).m_numElements == 4)) {
      ppSVar12 = (pSVar5->m_inputs).
                 super__Vector_base<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>._M_impl
                 .super__Vector_impl_data._M_start;
      while( true ) {
        if (ppSVar12 ==
            (pSVar5->m_inputs).
            super__Vector_base<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          return;
        }
        vertexOutput = findShaderOutputByName
                                 (local_1e8,((*ppSVar12)->m_variable->m_name)._M_dataplus._M_p);
        if (vertexOutput == (Variable *)0x0) break;
        std::vector<const_rsg::Variable_*,_std::allocator<const_rsg::Variable_*>_>::push_back
                  (&pRVar4->m_vertexOutputs,&vertexOutput);
        ppSVar12 = ppSVar12 + 1;
      }
      pIVar7 = (InternalError *)__cxa_allocate_exception(0x38);
      tcu::InternalError::InternalError
                (pIVar7,(char *)0x0,"vertexOutput",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsRandomShaderProgram.cpp"
                 ,0x96);
      __cxa_throw(pIVar7,&tcu::InternalError::typeinfo,tcu::Exception::~Exception);
    }
    pIVar7 = (InternalError *)__cxa_allocate_exception(0x38);
    tcu::InternalError::InternalError
              (pIVar7,(char *)0x0,
               "m_fragColorVar && m_fragColorVar->getType().getBaseType() == rsg::VariableType::TYPE_FLOAT && m_fragColorVar->getType().getNumElements() == 4"
               ,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsRandomShaderProgram.cpp"
               ,0x8e);
  }
  __cxa_throw(pIVar7,&tcu::InternalError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

RandomShaderProgram::RandomShaderProgram (const rsg::Shader& vertexShader, const rsg::Shader& fragmentShader, int numUnifiedUniforms, const rsg::ShaderInput* const* unifiedUniforms)
	: sglr::ShaderProgram	(generateProgramDeclaration(vertexShader, fragmentShader, numUnifiedUniforms, unifiedUniforms))
	, m_vertexShader		(vertexShader)
	, m_fragmentShader		(fragmentShader)
	, m_numUnifiedUniforms	(numUnifiedUniforms)
	, m_unifiedUniforms		(unifiedUniforms)
	, m_positionVar			(findShaderOutputByName(vertexShader, "gl_Position"))
	, m_fragColorVar		(findShaderOutputByLocation(fragmentShader, 0))
	, m_execCtx				(m_sampler2DMap, m_samplerCubeMap)
{
	TCU_CHECK_INTERNAL(m_positionVar && m_positionVar->getType().getBaseType() == rsg::VariableType::TYPE_FLOAT && m_positionVar->getType().getNumElements() == 4);
	TCU_CHECK_INTERNAL(m_fragColorVar && m_fragColorVar->getType().getBaseType() == rsg::VariableType::TYPE_FLOAT && m_fragColorVar->getType().getNumElements() == 4);

	// Build list of vertex outputs.
	for (vector<rsg::ShaderInput*>::const_iterator fragInIter = fragmentShader.getInputs().begin(); fragInIter != fragmentShader.getInputs().end(); ++fragInIter)
	{
		const rsg::ShaderInput*	fragInput		= *fragInIter;
		const rsg::Variable*	vertexOutput	= findShaderOutputByName(vertexShader, fragInput->getVariable()->getName());

		TCU_CHECK_INTERNAL(vertexOutput);
		m_vertexOutputs.push_back(vertexOutput);
	}
}